

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctime.cpp
# Opt level: O2

tm * booster::local_time(tm *__return_storage_ptr__,time_t pt)

{
  tm *ptVar1;
  runtime_error *this;
  allocator local_41;
  time_t pt_local;
  string local_38;
  
  pt_local = pt;
  ptVar1 = localtime_r(&pt_local,(tm *)__return_storage_ptr__);
  if (ptVar1 != (tm *)0x0) {
    return __return_storage_ptr__;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&local_38,"booster::local_time: Failed to convert time to local time",
             &local_41);
  runtime_error::runtime_error(this,&local_38);
  __cxa_throw(this,&runtime_error::typeinfo,runtime_error::~runtime_error);
}

Assistant:

std::tm local_time(time_t pt)
{
	#ifdef BOOSTER_WIN_NATIVE
	// WIN32 Uses TSL
	std::tm *res=::localtime(&pt);
	if(!res)
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	return *res;
	#else
	std::tm tm;
	if(!::localtime_r(&pt,&tm)) {
		throw runtime_error("booster::local_time: Failed to convert time to local time");
	}
	return tm;
	#endif
}